

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O1

void __thiscall
persistence_computer_t<directed_flag_complex_computer::directed_flag_complex_computer_t>::
compute_higher_persistence
          (persistence_computer_t<directed_flag_complex_computer::directed_flag_complex_computer_t>
           *this,unsigned_short min_dimension,unsigned_short max_dimension)

{
  iterator *piVar1;
  directed_flag_complex_computer_t *pdVar2;
  pair<float,_int> *ppVar3;
  int iVar4;
  ulong uVar5;
  filtered_directed_graph_t *pfVar6;
  vector<float,_std::allocator<float>_> *pvVar7;
  ostream *poVar8;
  pair<int,_int> pVar9;
  long lVar10;
  undefined6 in_register_00000012;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  long *plVar16;
  int dimension;
  ulong uVar17;
  bool bVar18;
  pivot_column_index_t pivot_column_index;
  allocator_type local_a9;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  deque<filtration_index_t,_std::allocator<filtration_index_t>_> *local_88;
  _Deque_base<int,_std::allocator<int>_> local_80;
  
  if ((int)CONCAT62(in_register_00000012,max_dimension) != 0) {
    local_a0 = (ulong)max_dimension;
    local_a8 = (ulong)min_dimension;
    local_88 = &this->columns_to_reduce;
    local_90 = (ulong)(min_dimension - 1);
    uVar17 = 1;
    do {
      dimension = (int)uVar17;
      directed_flag_complex_computer::directed_flag_complex_computer_t::prepare_next_dimension
                (this->complex,dimension);
      local_98 = uVar17 + 1;
      if ((local_98 == local_a8) &&
         (uVar13 = (uint)(this->complex->cell_count).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar17], 0 < (int)uVar13)) {
        lVar15 = 0;
        uVar12 = 0;
        do {
          pdVar2 = this->complex;
          if (pdVar2->filtration_algorithm == (filtration_algorithm_t *)0x0) {
            uVar5 = 0;
          }
          else {
            if (dimension == 1) {
              pfVar6 = pdVar2->graph;
              lVar10 = 0xc0;
LAB_00140795:
              pvVar7 = (vector<float,_std::allocator<float>_> *)
                       ((long)&(pfVar6->super_directed_graph_t).number_of_vertices + lVar10);
            }
            else {
              if (dimension == 0) {
                pfVar6 = pdVar2->graph;
                lVar10 = 0xa8;
                goto LAB_00140795;
              }
              pvVar7 = &pdVar2->next_filtration;
            }
            uVar5 = (ulong)(uint)(pvVar7->super__Vector_base<float,_std::allocator<float>_>)._M_impl
                                 .super__Vector_impl_data._M_start[uVar12];
          }
          local_80._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)(uVar5 + lVar15);
          ppVar3 = &((this->columns_to_reduce).
                     super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                     _M_impl.super__Deque_impl_data._M_finish._M_cur)->super_pair<float,_int>;
          if (ppVar3 == &(this->columns_to_reduce).
                         super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                         _M_impl.super__Deque_impl_data._M_finish._M_last[-1].super_pair<float,_int>
             ) {
            std::deque<filtration_index_t,_std::allocator<filtration_index_t>_>::
            _M_push_back_aux<filtration_index_t>(local_88,(filtration_index_t *)&local_80);
          }
          else {
            *ppVar3 = (pair<float,_int>)local_80._M_impl.super__Deque_impl_data._M_map;
            piVar1 = &(this->columns_to_reduce).
                      super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                      _M_impl.super__Deque_impl_data._M_finish;
            piVar1->_M_cur = piVar1->_M_cur + 1;
          }
          uVar12 = uVar12 + 1;
          lVar15 = lVar15 + 0x100000000;
        } while ((uVar13 & 0x7fffffff) != uVar12);
      }
      uVar12 = local_98;
      if (local_a8 <= local_98) {
        (*this->output->_vptr_output_t[5])(this->output,uVar17 & 0xffff);
        sort_columns(this);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"computing persistent homology in dimension ",0x2b);
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        poVar8 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\r",1);
        std::deque<int,_std::allocator<int>_>::deque
                  ((deque<int,_std::allocator<int>_> *)&local_80,
                   (this->complex->cell_count).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar12],&INVALID_INDEX,&local_a9);
        pVar9 = compute_pairs(this,dimension,(pivot_column_index_t *)&local_80,local_a8 <= uVar17);
        iVar14 = pVar9.second;
        if (uVar17 < local_a8) {
          if (((uVar17 == local_90) && (this->print_betti_numbers_to_console == true)) &&
             (this->max_entries != 0xffffffffffffffff)) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"# Skipped columns in dimension ",0x1f);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
            plVar16 = (long *)std::ostream::operator<<(poVar8,iVar14);
            std::ios::widen((char)*(undefined8 *)(*plVar16 + -0x18) + (char)plVar16);
            goto LAB_00140a3f;
          }
        }
        else {
          iVar11 = pVar9.first;
          (*this->output->_vptr_output_t[9])(this->output,(long)iVar11,(long)pVar9 >> 0x20);
          iVar4 = -iVar11;
          if ((uVar17 & 1) == 0) {
            iVar4 = iVar11;
          }
          this->euler_characteristic = this->euler_characteristic + iVar4;
          if (this->print_betti_numbers_to_console == true) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"dim H_",6);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
            std::ostream::operator<<(poVar8,iVar11);
            if (iVar14 != 0 && -1 < (long)pVar9) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout," (skipped ",10);
              poVar8 = (ostream *)std::ostream::operator<<(&std::cout,iVar14);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
            }
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
            plVar16 = &std::cout;
LAB_00140a3f:
            std::ostream::put((char)plVar16);
            std::ostream::flush();
          }
        }
        if (uVar17 < local_a0) {
          assemble_columns_to_reduce(this,dimension,(pivot_column_index_t *)&local_80);
        }
        if (this->complex->_is_top_dimension == true) {
          (*this->output->_vptr_output_t[10])();
          std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_80);
          return;
        }
        std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_80);
      }
      bVar18 = uVar17 != local_a0;
      uVar17 = local_98;
    } while (bVar18);
  }
  return;
}

Assistant:

void compute_higher_persistence(unsigned short min_dimension, unsigned short max_dimension) {
		for (auto dimension = 1u; dimension <= max_dimension; ++dimension) {
			complex.prepare_next_dimension(dimension);

			if (dimension + 1 == min_dimension) {
				// Here we need to reduce *all* cells because we did not compute anything of smaller dimension
				index_t number_of_cells = index_t(complex.number_of_cells(dimension));
				for (index_t index = 0; index < number_of_cells; index++) {
					columns_to_reduce.push_back(std::make_pair(complex.filtration(dimension, index), index));
				}
			}

			if (dimension + 1 < min_dimension) continue;

			output->computing_barcodes_in_dimension(dimension);

			sort_columns();

#ifdef INDICATE_PROGRESS
			std::cout << "\033[K"
			          << "computing persistent homology in dimension " << dimension << std::flush << "\r";
#endif
#ifdef USE_ARRAY_HASHMAP
			pivot_column_index_t pivot_column_index(complex.number_of_cells(dimension + 1), INVALID_INDEX);
#else
			pivot_column_index_t pivot_column_index;
			pivot_column_index.reserve(complex.number_of_cells(dimension + 1));
#endif

			auto betti = compute_pairs(dimension, pivot_column_index, dimension >= min_dimension);
			if (dimension >= min_dimension) {
				complex.computation_result(dimension, betti.first, betti.second);
#ifdef RETRIEVE_PERSISTENCE
				betti_numbers.push_back(betti.first);
#endif
				output->betti_number(betti.first, betti.second);
				euler_characteristic += (dimension & 1 ? -1 : 1) * betti.first;

				if (print_betti_numbers_to_console) {
					std::cout << "\033[K"
					          << "dim H_" << dimension << " = " << betti.first;
					if (betti.second > 0) { std::cout << " (skipped " << betti.second << ")"; }
					std::cout << std::endl;
				}
			} else if (int(dimension) == min_dimension - 1 && print_betti_numbers_to_console &&
			           max_entries < std::numeric_limits<size_t>::max()) {
				std::cout << "\033[K"
				          << "# Skipped columns in dimension " << dimension << ": " << betti.second << std::endl;
			}
			if (dimension < max_dimension) assemble_columns_to_reduce(dimension, pivot_column_index);

			// Stop early
			if (complex.is_top_dimension()) {
				output->remaining_homology_is_trivial();
				break;
			}
		}
	}